

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-tests.cpp
# Opt level: O0

int countLinesInFile(char *fileName)

{
  bool bVar1;
  istream *piVar2;
  istream local_240 [8];
  ifstream file;
  string local_38 [8];
  string line;
  int local_14;
  int numberOfLines;
  char *fileName_local;
  
  local_14 = 0;
  std::__cxx11::string::string(local_38);
  std::ifstream::ifstream(local_240,fileName,8);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_240,local_38);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    local_14 = local_14 + 1;
  }
  std::ifstream::~ifstream(local_240);
  std::__cxx11::string::~string(local_38);
  return local_14;
}

Assistant:

int countLinesInFile(const char* fileName) {
    int numberOfLines = 0;
    std::string line;
    std::ifstream file(fileName);

    while (std::getline(file, line)) {
        ++numberOfLines;
    }
    
    return numberOfLines;
}